

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::RegistryTest_throw_for_same_family_name_Test::TestBody
          (RegistryTest_throw_for_same_family_name_Test *this)

{
  bool bVar1;
  char *message;
  Builder<prometheus::Counter> *pBVar2;
  AssertHelper local_270;
  Message local_268;
  Builder<prometheus::Counter> local_260;
  byte local_1e9;
  undefined1 local_1e8 [7];
  bool gtest_caught_any;
  AssertHelper local_1c8;
  Message local_1c0 [6];
  exception *e;
  Builder<prometheus::Counter> local_188;
  undefined1 local_118 [8];
  TrueWithString gtest_msg;
  Registry registry;
  allocator local_31;
  undefined1 local_30 [8];
  string same_name;
  RegistryTest_throw_for_same_family_name_Test *this_local;
  
  same_name.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"same_name",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  Registry::Registry((Registry *)((long)&gtest_msg.value.field_2 + 8),Throw);
  memset(local_118,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)local_118);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)local_118);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      BuildCounter();
      pBVar2 = detail::Builder<prometheus::Counter>::Name(&local_188,(string *)local_30);
      detail::Builder<prometheus::Counter>::Register
                (pBVar2,(Registry *)((long)&gtest_msg.value.field_2 + 8));
      detail::Builder<prometheus::Counter>::~Builder(&local_188);
    }
  }
  else {
    testing::Message::Message(local_1c0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                   "Expected: BuildCounter().Name(same_name).Register(registry) doesn\'t throw an exception.\n  Actual: "
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/registry_test.cc"
               ,0x76,message);
    testing::internal::AssertHelper::operator=(&local_1c8,local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    std::__cxx11::string::~string((string *)local_1e8);
    testing::Message::~Message(local_1c0);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)local_118);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_1e9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      BuildCounter();
      pBVar2 = detail::Builder<prometheus::Counter>::Name(&local_260,(string *)local_30);
      detail::Builder<prometheus::Counter>::Register
                (pBVar2,(Registry *)((long)&gtest_msg.value.field_2 + 8));
      detail::Builder<prometheus::Counter>::~Builder(&local_260);
    }
    if ((local_1e9 & 1) != 0) goto LAB_0015efd5;
  }
  testing::Message::Message(&local_268);
  testing::internal::AssertHelper::AssertHelper
            (&local_270,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/registry_test.cc"
             ,0x77,
             "Expected: BuildCounter().Name(same_name).Register(registry) throws an exception.\n  Actual: it doesn\'t."
            );
  testing::internal::AssertHelper::operator=(&local_270,&local_268);
  testing::internal::AssertHelper::~AssertHelper(&local_270);
  testing::Message::~Message(&local_268);
LAB_0015efd5:
  Registry::~Registry((Registry *)((long)&gtest_msg.value.field_2 + 8));
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(RegistryTest, throw_for_same_family_name) {
  const auto same_name = std::string{"same_name"};
  Registry registry{Registry::InsertBehavior::Throw};

  EXPECT_NO_THROW(BuildCounter().Name(same_name).Register(registry));
  EXPECT_ANY_THROW(BuildCounter().Name(same_name).Register(registry));
}